

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  TestCaseInfo *pTVar1;
  ulong uVar2;
  TestCase *in_RSI;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_RDI;
  ReusableStringStream rss;
  string name;
  ReusableStringStream *in_stack_fffffffffffffea8;
  ReusableStringStream *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffed0;
  TestCase *in_stack_fffffffffffffed8;
  ReusableStringStream *in_stack_fffffffffffffee0;
  ReusableStringStream *in_stack_fffffffffffffef0;
  string local_30 [32];
  TestCase *local_10;
  
  local_10 = in_RSI;
  pTVar1 = TestCase::getTestCaseInfo(in_RSI);
  std::__cxx11::string::string(local_30,(string *)pTVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (in_RDI,in_stack_fffffffffffffeb8);
  }
  else {
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffee0);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffeb0,(char (*) [21])in_stack_fffffffffffffea8);
    in_RDI[2].super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&((in_RDI[2].super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_TestCaseInfo).name.
                   field_0x1;
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffeb0,(unsigned_long *)in_stack_fffffffffffffea8);
    ReusableStringStream::str_abi_cxx11_(in_stack_fffffffffffffea8);
    TestCase::withName(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    (**(code **)&(((in_RDI->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                   _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).className)
              (in_RDI,&stack0xfffffffffffffef0);
    TestCase::~TestCase(local_10);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    ReusableStringStream::~ReusableStringStream(in_stack_fffffffffffffef0);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void TestRegistry::registerTest( TestCase const& testCase ) {
        std::string name = testCase.getTestCaseInfo().name;
        if( name.empty() ) {
            ReusableStringStream rss;
            rss << "Anonymous test case " << ++m_unnamedCount;
            return registerTest( testCase.withName( rss.str() ) );
        }
        m_functions.push_back( testCase );
    }